

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O2

void __thiscall
snmalloc::
FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
::register_range(FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                 *this,address_t p,size_t length)

{
  void *p_00;
  size_t size;
  
  p_00 = (void *)((long)&(this->body->
                         super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                         ).super_MetaEntryBase.meta + (p >> 10 & 0xfffffffffffffff0) &
                 0xfffffffffffff000);
  size = ((long)&this->body[0xff].
                 super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                 .super_MetaEntryBase.remote_and_sizeclass +
          (p + length + 0x3fff >> 10 & 0xfffffffffffffff0) + 7 & 0xfffffffffffff000) - (long)p_00;
  PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::notify_using<(snmalloc::ZeroMem)0>(p_00,size);
  PALLinux::notify_do_dump(p_00,size);
  return;
}

Assistant:

void register_range(address_t p, size_t length)
    {
      SNMALLOC_ASSERT(is_initialised());

      if constexpr (has_bounds)
      {
        if ((p - base >= size) || (p + length - base > size))
        {
          PAL::error("Internal error: Pagemap registering out of range.");
        }
        p = p - base;
      }

      // Calculate range in pagemap that is associated to this space.
      auto first = &body[p >> SHIFT];
      auto last = &body[(p + length + bits::one_at_bit(SHIFT) - 1) >> SHIFT];

      // Commit OS pages associated to the range.
      auto page_start = pointer_align_down<OS_PAGE_SIZE, char>(first);
      auto page_end = pointer_align_up<OS_PAGE_SIZE, char>(last);
      size_t using_size = pointer_diff(page_start, page_end);
      PAL::template notify_using<NoZero>(page_start, using_size);
      if constexpr (pal_supports<CoreDump, PAL>)
      {
        PAL::notify_do_dump(page_start, using_size);
      }
    }